

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::RequestHolder::RequestHolder
          (RequestHolder *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  uint32_t uVar1;
  long lVar2;
  
  std::__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2> *)this,
             &aRequest->
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            (&this->mHandler,aHandler);
  this->mRetransmissionCount = 0;
  (this->mNextTimerShot).__d.__r = 0;
  this->mAcknowledged = false;
  uVar1 = random::non_crypto::GetUint32();
  (this->mRetransmissionDelay).__r = (ulong)(uVar1 % 1000 + 2000);
  lVar2 = std::chrono::_V2::system_clock::now();
  (this->mNextTimerShot).__d.__r = (this->mRetransmissionDelay).__r * 1000000 + lVar2;
  return;
}

Assistant:

Coap::RequestHolder::RequestHolder(const RequestPtr &aRequest, ResponseHandler aHandler)
    : mRequest(aRequest)
    , mHandler(aHandler)
    , mRetransmissionCount(0)
    , mAcknowledged(false)
{
    uint32_t lowBound    = 1000 * kAckTimeout;
    uint32_t upperBound  = 1000 * kAckTimeout * kAckRandomFactorNumerator / kAckRandomFactorDenominator;
    uint32_t delay       = random::non_crypto::GetUint32InRange(lowBound, upperBound);
    mRetransmissionDelay = std::chrono::milliseconds(delay);
    mNextTimerShot       = Clock::now() + mRetransmissionDelay;
}